

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signature.hpp
# Opt level: O3

uint __thiscall
Kernel::Signature::addNumeralConstant<Kernel::RationalConstantType>
          (Signature *this,RationalConstantType *number_)

{
  Symbol ***pppSVar1;
  SymbolMap *this_00;
  __mpz_struct *r;
  Symbol **ppSVar2;
  Symbol **ppSVar3;
  uint *puVar4;
  ResultOf<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Coproduct_hpp:601:3),_Constant<0>_>_conflict6
  RVar5;
  Symbol *pSVar6;
  Symbol **ppSVar7;
  uint uVar8;
  pair<Kernel::RationalConstantType,_unsigned_int> *this_01;
  uint uVar9;
  IntegerConstantType *pIVar10;
  anon_class_16_2_d708292f f;
  RationalConstantType number;
  SymbolKey key;
  anon_class_1_0_00000001 local_125;
  uint local_124;
  undefined1 local_120 [32];
  RationalConstantType local_100;
  undefined1 local_e0 [17];
  IntegerConstantType local_cf;
  Coproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>
  local_b4;
  pair<Kernel::RationalConstantType,_unsigned_int> local_88;
  DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>_>_>_>
  local_5c;
  
  local_120._0_4_ = 0;
  this_01 = &local_88;
  std::pair<Kernel::RationalConstantType,_unsigned_int>::
  pair<Kernel::RationalConstantType,_unsigned_int,_true>(this_01,number_,(uint *)local_120);
  Lib::
  Coproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>
  ::Coproduct<std::pair<Kernel::RationalConstantType,_unsigned_int>,_0>
            ((Coproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>
              *)local_e0,this_01);
  mpz_clear(local_88.first._den._val);
  mpz_clear((__mpz_struct *)&local_88);
  Lib::CoproductImpl::TrivialOperations::CopyCons::
  DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>_>_>_>
  ::DefaultImpl(&local_5c,
                (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>_>_>_>
                 *)local_e0);
  this_00 = &this->_funNames;
  Lib::
  Map<Lib::Coproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>,_unsigned_int,_Lib::DefaultHash>
  ::tryGet((Map<Lib::Coproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>,_unsigned_int,_Lib::DefaultHash>
            *)local_120,
           (Coproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>
            *)this_00);
  puVar4 = (uint *)CONCAT44(local_120._4_4_,local_120._0_4_);
  if (puVar4 != (uint *)0x0) {
    this_01 = (pair<Kernel::RationalConstantType,_unsigned_int> *)(ulong)*puVar4;
  }
  uVar8 = (uint)this_01;
  Lib::CoproductImpl::
  RawCoproduct<std::pair<std::__cxx11::string,unsigned_int>,std::__cxx11::string,std::pair<Kernel::IntegerConstantType,unsigned_int>,std::pair<Kernel::RationalConstantType,unsigned_int>,std::pair<Kernel::RealConstantType,unsigned_int>,std::pair<Kernel::Theory::Interpretation,Kernel::OperatorType*>>
  ::
  switchN<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<std::pair<std::__cxx11::string,unsigned_int>,std::__cxx11::string,std::pair<Kernel::IntegerConstantType,unsigned_int>,std::pair<Kernel::RationalConstantType,unsigned_int>,std::pair<Kernel::RealConstantType,unsigned_int>,std::pair<Kernel::Theory::Interpretation,Kernel::OperatorType*>>>::~DefaultImpl()::_lambda(auto:1)_1_>
            ((RawCoproduct<std::pair<std::__cxx11::string,unsigned_int>,std::__cxx11::string,std::pair<Kernel::IntegerConstantType,unsigned_int>,std::pair<Kernel::RationalConstantType,unsigned_int>,std::pair<Kernel::RealConstantType,unsigned_int>,std::pair<Kernel::Theory::Interpretation,Kernel::OperatorType*>>
              *)&local_5c,(anon_class_8_1_8991fb9c)&local_5c);
  if (puVar4 == (uint *)0x0) {
    ppSVar2 = (this->_funs)._cursor;
    ppSVar3 = (this->_funs)._stack;
    pIVar10 = (IntegerConstantType *)0x0;
    if (((byte)local_e0[0] & 7) == 3) {
      pIVar10 = (IntegerConstantType *)(local_e0 + 1);
    }
    IntegerConstantType::IntegerConstantType((IntegerConstantType *)local_120,pIVar10);
    r = (__mpz_struct *)(local_120 + 0x10);
    pIVar10 = (IntegerConstantType *)&DAT_00000010;
    if (((byte)local_e0[0] & 7) == 3) {
      pIVar10 = &local_cf;
    }
    IntegerConstantType::IntegerConstantType((IntegerConstantType *)r,pIVar10);
    this->_rationals = this->_rationals + 1;
    IntegerConstantType::IntegerConstantType(&local_100._num,(IntegerConstantType *)local_120);
    IntegerConstantType::IntegerConstantType(&local_100._den,(IntegerConstantType *)r);
    pSVar6 = newNumeralConstantSymbol(this,&local_100);
    mpz_clear(local_100._den._val);
    mpz_clear((__mpz_struct *)&local_100);
    ppSVar7 = (this->_funs)._cursor;
    if (ppSVar7 == (this->_funs)._end) {
      Lib::Stack<Kernel::Signature::Symbol_*>::expand(&this->_funs);
      ppSVar7 = (this->_funs)._cursor;
    }
    *ppSVar7 = pSVar6;
    pppSVar1 = &(this->_funs)._cursor;
    *pppSVar1 = *pppSVar1 + 1;
    Lib::CoproductImpl::TrivialOperations::CopyCons::
    DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>_>_>_>
    ::DefaultImpl(&local_b4._inner,
                  (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>_>_>_>
                   *)local_e0);
    uVar8 = (uint)((ulong)((long)ppSVar2 - (long)ppSVar3) >> 3);
    local_124 = uVar8;
    if ((this->_funNames)._maxEntries <= (this->_funNames)._noOfEntries) {
      Lib::
      Map<Lib::Coproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>,_unsigned_int,_Lib::DefaultHash>
      ::expand(this_00);
    }
    f.this = &local_b4;
    f.f = &local_125;
    RVar5 = Lib::CoproductImpl::
            RawCoproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>
            ::
            switchN<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Coproduct_hpp:601:3)>
                      ((RawCoproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>
                        *)&local_b4,f);
    uVar9 = (byte)local_b4._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>_>
                  .
                  super_RawCoproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>
                  ._0_1_ & 7;
    uVar9 = (uVar9 >> 2) + RVar5 + uVar9 * 0x40 + 0x9e3779b9 ^ uVar9;
    Lib::
    Map<Lib::Coproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>,_unsigned_int,_Lib::DefaultHash>
    ::insert(this_00,&local_b4,&local_124,uVar9 + (uVar9 == 0));
    Lib::CoproductImpl::
    RawCoproduct<std::pair<std::__cxx11::string,unsigned_int>,std::__cxx11::string,std::pair<Kernel::IntegerConstantType,unsigned_int>,std::pair<Kernel::RationalConstantType,unsigned_int>,std::pair<Kernel::RealConstantType,unsigned_int>,std::pair<Kernel::Theory::Interpretation,Kernel::OperatorType*>>
    ::
    switchN<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<std::pair<std::__cxx11::string,unsigned_int>,std::__cxx11::string,std::pair<Kernel::IntegerConstantType,unsigned_int>,std::pair<Kernel::RationalConstantType,unsigned_int>,std::pair<Kernel::RealConstantType,unsigned_int>,std::pair<Kernel::Theory::Interpretation,Kernel::OperatorType*>>>::~DefaultImpl()::_lambda(auto:1)_1_>
              ((RawCoproduct<std::pair<std::__cxx11::string,unsigned_int>,std::__cxx11::string,std::pair<Kernel::IntegerConstantType,unsigned_int>,std::pair<Kernel::RationalConstantType,unsigned_int>,std::pair<Kernel::RealConstantType,unsigned_int>,std::pair<Kernel::Theory::Interpretation,Kernel::OperatorType*>>
                *)&local_b4,(anon_class_8_1_8991fb9c)&local_b4);
    mpz_clear(r);
    mpz_clear((__mpz_struct *)local_120);
  }
  Lib::CoproductImpl::
  RawCoproduct<std::pair<std::__cxx11::string,unsigned_int>,std::__cxx11::string,std::pair<Kernel::IntegerConstantType,unsigned_int>,std::pair<Kernel::RationalConstantType,unsigned_int>,std::pair<Kernel::RealConstantType,unsigned_int>,std::pair<Kernel::Theory::Interpretation,Kernel::OperatorType*>>
  ::
  switchN<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<std::pair<std::__cxx11::string,unsigned_int>,std::__cxx11::string,std::pair<Kernel::IntegerConstantType,unsigned_int>,std::pair<Kernel::RationalConstantType,unsigned_int>,std::pair<Kernel::RealConstantType,unsigned_int>,std::pair<Kernel::Theory::Interpretation,Kernel::OperatorType*>>>::~DefaultImpl()::_lambda(auto:1)_1_>
            ((RawCoproduct<std::pair<std::__cxx11::string,unsigned_int>,std::__cxx11::string,std::pair<Kernel::IntegerConstantType,unsigned_int>,std::pair<Kernel::RationalConstantType,unsigned_int>,std::pair<Kernel::RealConstantType,unsigned_int>,std::pair<Kernel::Theory::Interpretation,Kernel::OperatorType*>>
              *)local_e0,(anon_class_8_1_8991fb9c)local_e0);
  return uVar8;
}

Assistant:

unsigned addNumeralConstant(Numeral number_) {
    auto key = SymbolKey(std::make_pair(std::move(number_), unsigned(0)));
    unsigned result;
    if (_funNames.find(key,result)) {
      return result;
    }
    result = _funs.length();
    // copy number out of key again
    auto number = key.as<std::pair<Numeral, unsigned>>()->first;
    noteOccurrence(number);
    Symbol* sym = newNumeralConstantSymbol(std::move(number));
    _funs.push(sym);
    _funNames.insert(key,result);
    return result;
  }